

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::ScalarReplacementPass::GetStorageType(ScalarReplacementPass *this,Instruction *inst)

{
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  
  if (inst->opcode_ == OpVariable) {
    uVar1 = Instruction::type_id(inst);
    pDVar2 = Pass::get_def_use_mgr((Pass *)this);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
    uVar1 = Instruction::GetSingleWordInOperand(pIVar3,1);
    pDVar2 = Pass::get_def_use_mgr((Pass *)this);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
    return pIVar3;
  }
  __assert_fail("inst->opcode() == spv::Op::OpVariable",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/scalar_replacement_pass.cpp"
                ,0x255,
                "Instruction *spvtools::opt::ScalarReplacementPass::GetStorageType(const Instruction *) const"
               );
}

Assistant:

Instruction* ScalarReplacementPass::GetStorageType(
    const Instruction* inst) const {
  assert(inst->opcode() == spv::Op::OpVariable);

  uint32_t ptrTypeId = inst->type_id();
  uint32_t typeId =
      get_def_use_mgr()->GetDef(ptrTypeId)->GetSingleWordInOperand(1u);
  return get_def_use_mgr()->GetDef(typeId);
}